

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

void leccalc::doit(string *subfolder,FILE **fout,bool useReturnPeriodFile,bool skipheader,
                  bool *outputFlags,bool ordFlag,string *parquetFileNames,char *progname)

{
  iterator __position;
  undefined4 *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool *outputFlags_00;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  FILE *pFVar8;
  long lVar9;
  char *pcVar10;
  vector<long_long,std::allocator<long_long>> *this;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  undefined8 extraout_RAX;
  undefined7 in_register_00000009;
  _Base_ptr p_Var13;
  long lVar14;
  _Rb_tree_header *p_Var15;
  pointer inFile;
  _Rb_tree_header *p_Var16;
  _Base_ptr p_Var17;
  undefined4 *puVar18;
  FILE *__stream;
  char cVar19;
  int file_index;
  int last_summary_id;
  FILE *in;
  int summary_id;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  out_loss;
  longlong offset;
  sampleslevelRec sr;
  int totalperiods;
  string s;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexFiles;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> fileHandles;
  summarySampleslevelHeader sh;
  vector<int,_std::allocator<int>_> fileIDs_agg;
  vector<int,_std::allocator<int>_> fileIDs_occ;
  longlong file_offset;
  set<int,_std::less<int>,_std::allocator<int>_> summaryids;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  event_to_periods;
  aggreports agg;
  string fileList;
  uint local_13f4;
  FILE *local_13f0;
  int local_13e4;
  uint local_13e0;
  int local_13dc;
  FILE *local_13d8;
  key_type local_13d0 [2];
  undefined1 local_13c0 [20];
  uint local_13ac;
  int local_13a8;
  int local_13a4;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_13a0;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_1388;
  int local_1364;
  undefined4 local_1360;
  int local_135c;
  undefined1 local_1358 [32];
  _Rb_tree_node_base *local_1338;
  size_t local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12e8;
  void *local_12c8;
  iterator iStack_12c0;
  _IO_FILE **local_12b8;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  local_12b0;
  vector<int,_std::allocator<int>_> local_1298;
  vector<int,_std::allocator<int>_> local_1278;
  FILE *local_1260;
  _Rb_tree_header *local_1258;
  long local_1250;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1248;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1218;
  undefined1 *local_11e8 [2];
  undefined1 local_11d8 [16];
  aggreports local_11c8;
  char *local_1038 [2];
  char local_1028 [4088];
  
  local_13d8 = (FILE *)CONCAT44(local_13d8._4_4_,(int)CONCAT71(in_register_00000009,skipheader));
  local_13f0 = (FILE *)outputFlags;
  std::operator+(&local_1328,"work/",subfolder);
  std::__cxx11::string::substr((ulong)local_1038,(ulong)&local_1328);
  iVar4 = std::__cxx11::string::compare((char *)local_1038);
  if (local_1038[0] != local_1028) {
    operator_delete(local_1038[0]);
  }
  if (iVar4 != 0) {
    local_1038[0] = local_1028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1038,local_1328._M_dataplus._M_p,
               local_1328._M_dataplus._M_p + local_1328._M_string_length);
    std::__cxx11::string::append((char *)local_1038);
    std::__cxx11::string::operator=((string *)&local_1328,(string *)local_1038);
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0]);
    }
  }
  local_1218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1218._M_impl.super__Rb_tree_header._M_header;
  local_1218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1218._M_impl.super__Rb_tree_header._M_header._M_left;
  loadoccurrence((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_1218,&local_135c);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::vector(&local_13a0,2,(allocator_type *)local_1038);
  local_13e0 = (uint)useReturnPeriodFile;
  aggreports::aggreports
            (&local_11c8,local_135c,fout,useReturnPeriodFile,(bool *)local_13f0,ordFlag,
             parquetFileNames,progname);
  outputFlags_00 = aggreports::GetOutputFlags(&local_11c8);
  local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bVar3 = setupoutputfiles(fout,ordFlag,outputFlags_00,(bool)(byte)local_13d8,&local_1278,
                           &local_1298,&local_11c8);
  local_13d8 = (FILE *)CONCAT71(local_13d8._1_7_,bVar3);
  local_1308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12b8 = (_IO_FILE **)0x0;
  local_12c8 = (void *)0x0;
  iStack_12c0._M_current = (_IO_FILE **)0x0;
  local_12e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f4 = 0;
  local_1248._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1248._M_impl.super__Rb_tree_header._M_header;
  local_1248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1248._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1248._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1248._M_impl.super__Rb_tree_header._M_header._M_left;
  if (subfolder->_M_string_length == 0) {
    processinputfile(&local_13f4,
                     (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)&local_1218,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1248,
                     &local_13a0,SUB41(local_13e0,0),&local_11c8);
LAB_001039c0:
    outputaggreports(&local_11c8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1248,
                     &local_13a0,local_13f4,&local_1278,&local_1298,(bool)(byte)local_13d8);
LAB_001039f6:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_12e8);
    if (local_12c8 != (void *)0x0) {
      operator_delete(local_12c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1308);
    if (local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
    ::~_Rb_tree(&local_11c8.fileHeaders_._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_11c8.ensembletosidx_._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_11c8.periodstoweighting_._M_t);
    if (local_11c8.returnperiods_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_11c8.returnperiods_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
    ::~_Rb_tree(&local_11c8.wheatSheaf_._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_11c8.summaryids_._M_t);
    std::
    vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
    ::~vector(&local_13a0);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_1218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
      operator_delete(local_1328._M_dataplus._M_p);
    }
    return;
  }
  local_1038[0] = local_1028;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1038,local_1328._M_dataplus._M_p,
             local_1328._M_dataplus._M_p + local_1328._M_string_length);
  std::__cxx11::string::append((char *)local_1038);
  local_13f0 = fopen(local_1038[0],"w");
  if (local_13f0 == (FILE *)0x0) goto LAB_00103b49;
  __dirp = opendir(local_1328._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar6 = readdir(__dirp);
      if (pdVar6 == (dirent *)0x0) break;
      local_1358._0_8_ = local_1358 + 0x10;
      sVar7 = strlen(pdVar6->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1358,pdVar6->d_name,pdVar6->d_name + sVar7);
      if ((ulong)local_1358._8_8_ < 5) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_11e8,(ulong)local_1358);
        iVar4 = std::__cxx11::string::compare((char *)local_11e8);
        bVar3 = iVar4 == 0;
        if (local_11e8[0] != local_11d8) {
          operator_delete(local_11e8[0]);
        }
      }
      if (bVar3) {
        local_13d0[0] = (key_type)local_13c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_13d0,local_1328._M_dataplus._M_p,
                   local_1328._M_dataplus._M_p + local_1328._M_string_length);
        std::__cxx11::string::append((char *)local_13d0);
        std::__cxx11::string::operator=((string *)local_1358,(string *)local_13d0);
        if (local_13d0[0] != (key_type)local_13c0) {
          operator_delete((void *)local_13d0[0]);
        }
        local_13d0[0] = (key_type)fopen((char *)local_1358._0_8_,"rb");
        if (local_13d0[0] == (key_type)0x0) goto LAB_00103b15;
        checkinputfile(&local_13f4,(FILE *)local_13d0[0],&local_11c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_1308,(value_type *)local_1358);
        if (iStack_12c0._M_current == local_12b8) {
          std::vector<_IO_FILE*,std::allocator<_IO_FILE*>>::_M_realloc_insert<_IO_FILE*const&>
                    ((vector<_IO_FILE*,std::allocator<_IO_FILE*>> *)&local_12c8,iStack_12c0,
                     (_IO_FILE **)local_13d0);
        }
        else {
          *iStack_12c0._M_current = (_IO_FILE *)local_13d0[0];
          iStack_12c0._M_current = iStack_12c0._M_current + 1;
        }
        fprintf(local_13f0,"%s\n",local_1358._0_8_);
        if ((ulong)local_1358._8_8_ < 4) goto LAB_00103b22;
        *(char *)(local_1358._0_8_ + (local_1358._8_8_ - 4)) = '\0';
        local_1358._8_8_ = local_1358._8_8_ - 4;
        std::__cxx11::string::append((char *)local_1358);
        pFVar8 = fopen((char *)local_1358._0_8_,"r");
        if (pFVar8 != (FILE *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_12e8,(value_type *)local_1358);
          fclose(pFVar8);
        }
      }
      if ((undefined1 *)local_1358._0_8_ != local_1358 + 0x10) {
        operator_delete((void *)local_1358._0_8_);
      }
    }
    fclose(local_13f0);
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0]);
    }
    lVar9 = (long)local_1308.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1308.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar14 = (long)local_12e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_12e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar9 == lVar14) {
      local_13e4 = 0;
      local_1358._24_8_ = local_1358 + 8;
      local_1358._8_8_ = local_1358._8_8_ & 0xffffffff00000000;
      local_1358._16_8_ = 0;
      local_1330 = 0;
      local_1338 = (_Rb_tree_node_base *)local_1358._24_8_;
      if (local_12e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_12e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pFVar8 = (FILE *)local_12e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_13f0 = pFVar8;
          pFVar8 = fopen(*(char **)pFVar8,"r");
          local_13d0[0].fileindex = local_13e4;
          local_13e4 = local_13e4 + 1;
          while (pcVar10 = fgets((char *)local_1038,0x1000,pFVar8), pcVar10 != (char *)0x0) {
            iVar4 = __isoc99_sscanf(local_1038,"%d,%lld",local_13d0,&local_1388);
            if (iVar4 != 2) {
              doit();
              goto LAB_00103b15;
            }
            this = (vector<long_long,std::allocator<long_long>> *)
                   std::
                   map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ::operator[]((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                 *)local_1358,local_13d0);
            __position._M_current = *(longlong **)(this + 8);
            if (__position._M_current == *(longlong **)(this + 0x10)) {
              std::vector<long_long,std::allocator<long_long>>::_M_realloc_insert<long_long_const&>
                        (this,__position,(longlong *)&local_1388);
            }
            else {
              *__position._M_current =
                   (longlong)
                   local_1388.
                   super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              *(longlong **)(this + 8) = __position._M_current + 1;
            }
          }
          fclose(pFVar8);
          pFVar8 = (FILE *)&local_13f0->_IO_write_base;
        } while (pFVar8 != (FILE *)local_12e8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_13d0[0] = (key_type)local_13c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_13d0,local_1328._M_dataplus._M_p,
                 local_1328._M_dataplus._M_p + local_1328._M_string_length);
      std::__cxx11::string::append((char *)local_13d0);
      pFVar8 = fopen((char *)local_13d0[0],"w");
      p_Var11 = (_Rb_tree_node_base *)local_1358._24_8_;
      if (pFVar8 != (FILE *)0x0) {
        for (; p_Var11 != (_Rb_tree_node_base *)(local_1358 + 8);
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          for (p_Var17 = p_Var11[1]._M_parent; p_Var17 != p_Var11[1]._M_left;
              p_Var17 = (_Base_ptr)&p_Var17->_M_parent) {
            fprintf(pFVar8,"%d,%d,%lld\n",(ulong)p_Var11[1]._M_color,
                    (ulong)*(uint *)&p_Var11[1].field_0x4,*(undefined8 *)p_Var17);
          }
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::clear((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 *)local_1358);
        fclose(pFVar8);
        local_13e4 = 0;
        local_13dc = -1;
        local_1260 = fopen((char *)local_13d0[0],"r");
        pcVar10 = fgets((char *)local_1038,0x1000,local_1260);
        local_13ac = (uint)(byte)local_13d8;
        if (pcVar10 != (char *)0x0) {
          iVar4 = -1;
          pFVar8 = (FILE *)0x0;
          do {
            p_Var15 = &local_1218._M_impl.super__Rb_tree_header;
            iVar5 = __isoc99_sscanf(local_1038,"%d,%d,%lld",&local_13a4,&local_13e4,&local_1250);
            if (iVar5 != 3) goto LAB_00103b37;
            if (local_13dc != local_13a4) {
              if (local_13dc != -1) {
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                clear(&local_1248);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_1248,&local_13dc);
                outputaggreports(&local_11c8,
                                 (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1248,
                                 &local_13a0,local_13f4,&local_1278,&local_1298,SUB41(local_13ac,0))
                ;
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::vector(&local_12b0,2,(allocator_type *)&local_1364);
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_13a0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_13a0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_1388.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_13a0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_13a0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_12b0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_13a0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_12b0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_13a0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_12b0.
                     super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_12b0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_12b0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_12b0.
                super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::~vector(&local_1388);
                std::
                vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                ::~vector(&local_12b0);
              }
              local_13dc = local_13a4;
            }
            __stream = pFVar8;
            if (iVar4 != local_13e4) {
              __stream = *(FILE **)((long)local_12c8 + (long)local_13e4 * 8);
              iVar4 = local_13e4;
            }
            pFVar8 = __stream;
            if (__stream != (FILE *)0x0) {
              fseek(__stream,local_1250,0);
              sVar7 = fread(&local_12b0,0xc,1,__stream);
              p_Var13 = &p_Var15->_M_header;
              for (p_Var17 = local_1218._M_impl.super__Rb_tree_header._M_header._M_parent;
                  (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
                  p_Var17 = (&p_Var17->_M_left)
                            [(int)*(size_t *)(p_Var17 + 1) <
                             (int)local_12b0.
                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start]) {
                if ((int)local_12b0.
                         super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start <= (int)*(size_t *)(p_Var17 + 1))
                {
                  p_Var13 = p_Var17;
                }
              }
              p_Var16 = p_Var15;
              if (((_Rb_tree_header *)p_Var13 != p_Var15) &&
                 (p_Var16 = (_Rb_tree_header *)p_Var13,
                 (int)local_12b0.
                      super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start <
                 (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
                p_Var16 = p_Var15;
              }
              local_13a8 = iVar4;
              if ((p_Var16 != p_Var15) && (local_13d8 = __stream, p_Var15 = p_Var16, sVar7 != 0)) {
                do {
                  local_1258 = p_Var15;
                  sVar7 = fread(&local_1364,8,1,__stream);
                  cVar19 = local_1364 == 0;
                  if ((sVar7 == 1) &&
                     ((5 < local_1364 + 5U || ((0x23U >> (local_1364 + 5U & 0x1f) & 1) == 0)))) {
                    local_13e0 = CONCAT31(local_13e0._1_3_,cVar19);
                    local_1388.
                    super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_1388.
                                           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           local_12b0.
                                           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_);
                    local_1388.
                    super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)CONCAT44(local_1388.
                                           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           local_1364);
                    puVar18 = *(undefined4 **)(p_Var16 + 1);
                    puVar1 = *(undefined4 **)((long)(p_Var16 + 1) + 8);
                    if (puVar18 != puVar1) {
                      bVar3 = local_1364 != -1;
                      local_13f0 = (FILE *)CONCAT44(local_13f0._4_4_,local_1360);
                      do {
                        local_1388.
                        super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)CONCAT44(*puVar18,(int)local_1388.
                                                                                                                          
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        uVar2 = (uint)bVar3;
                        pmVar12 = std::
                                  map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                  ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                *)(&((local_13a0.
                                                                                                            
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar2 * 0x30),
                                               (key_type *)&local_1388);
                        pmVar12->agg_out_loss = pmVar12->agg_out_loss + local_13f0._0_4_;
                        pmVar12 = std::
                                  map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                  ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                *)(&((local_13a0.
                                                                                                            
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar2 * 0x30),
                                               (key_type *)&local_1388);
                        if (pmVar12->max_out_loss <= local_13f0._0_4_ &&
                            local_13f0._0_4_ != pmVar12->max_out_loss) {
                          pmVar12 = std::
                                    map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                    ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                                  *)(&((local_13a0.
                                                                                                                
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                                  _M_impl.field_0x0 + uVar2 * 0x30),
                                                 (key_type *)&local_1388);
                          pmVar12->max_out_loss = local_13f0._0_4_;
                        }
                        puVar18 = puVar18 + 1;
                      } while (puVar18 != puVar1);
                    }
                    p_Var16 = local_1258;
                    __stream = local_13d8;
                    cVar19 = (char)local_13e0;
                  }
                  pFVar8 = local_13d8;
                  iVar4 = local_13a8;
                  p_Var15 = local_1258;
                } while (sVar7 == 1 && cVar19 == '\0');
              }
            }
            pcVar10 = fgets((char *)local_1038,0x1000,local_1260);
          } while (pcVar10 != (char *)0x0);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  (&local_1248);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_1248,&local_13dc);
        outputaggreports(&local_11c8,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_1248,
                         &local_13a0,local_13f4,&local_1278,&local_1298,SUB41(local_13ac,0));
        if (local_13d0[0] != (key_type)local_13c0) {
          operator_delete((void *)local_13d0[0]);
        }
        std::
        _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)local_1358);
        goto LAB_001039f6;
      }
      goto LAB_00103b63;
    }
    if (local_12e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_12e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      fprintf(_stderr,"%d summary index files missing: Ignoring summary index files.\n",
              (ulong)(uint)((int)lVar14 - (int)lVar9));
    }
    if (local_1308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1308.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      inFile = local_1308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        setinputstream(inFile);
        processinputfile(&local_13f4,
                         (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)&local_1218,
                         (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1248,&local_13a0,
                         SUB41(local_13e0,0),&local_11c8);
        inFile = inFile + 1;
      } while (inFile != local_1308.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_001039c0;
  }
  goto LAB_00103b56;
LAB_00103b15:
  doit((leccalc *)local_1358);
LAB_00103b22:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
LAB_00103b37:
  doit();
LAB_00103b49:
  doit((leccalc *)local_1038);
LAB_00103b56:
  doit((leccalc *)&local_1328);
LAB_00103b63:
  doit((leccalc *)local_13d0);
  if (local_13d0[0] != (key_type)local_13c0) {
    operator_delete((void *)local_13d0[0]);
  }
  std::
  _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)local_1358);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_12e8);
  if (local_12c8 != (void *)0x0) {
    operator_delete(local_12c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1308);
  if (local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  aggreports::~aggreports(&local_11c8);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::~vector(&local_13a0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_1218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
    operator_delete(local_1328._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void doit(const std::string &subfolder, FILE **fout,
		  const bool useReturnPeriodFile, bool skipheader,
		  bool *outputFlags, bool ordFlag,
		  const std::string *parquetFileNames,
		  const char *progname)
	{
		std::string path = "work/" + subfolder;
		if (path.substr(path.length() - 1, 1) != "/") {
			path = path + "/";
		}
		std::map<int, std::vector<int> > event_to_periods;
		int totalperiods;
		loadoccurrence(event_to_periods, totalperiods);
		std::vector<std::map<outkey2, OutLosses>> out_loss(2);

		aggreports agg(totalperiods, fout, useReturnPeriodFile,
			       outputFlags, ordFlag, parquetFileNames,
			       progname);
		outputFlags = agg.GetOutputFlags();

		std::vector<int> fileIDs_occ, fileIDs_agg;
		bool hasEPT = setupoutputfiles(fout, ordFlag, outputFlags,
					       skipheader, fileIDs_occ,
					       fileIDs_agg, agg);

		std::vector<std::string> files;
		std::vector<FILE*> fileHandles;
		std::vector<std::string> indexFiles;
		unsigned int samplesize=0;
		std::set<int> summaryids;
		if (subfolder.size() == 0) {
			processinputfile(samplesize, event_to_periods,
					 summaryids, out_loss,
					 useReturnPeriodFile, agg);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
			return;
		} else {
			// Store order of input files for future reference
			std::string fileList = path + "filelist.idx";
			FILE * flist = fopen(fileList.c_str(), "w");
			if (flist == nullptr) {
				fprintf(stderr, "FATAL: Cannot open %s\n", fileList.c_str());
				exit(EXIT_FAILURE);
			}
			DIR* dir;
			struct dirent* ent;
			if ((dir = opendir(path.c_str())) != NULL) {
				while ((ent = readdir(dir)) != NULL) {
					std::string s = ent->d_name;
					if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
						s = path + ent->d_name;
						FILE * in = fopen(s.c_str(), "rb");
						if (in != nullptr) {
							checkinputfile(samplesize, in, agg);
						} else {
							fprintf(stderr, "FATAL: Cannot open %s\n", s.c_str());
							exit(EXIT_FAILURE);
						}
						files.push_back(s);   // Build input file list
						fileHandles.push_back(in);
						fprintf(flist, "%s\n", s.c_str());
						// Check for index file
						s.erase(s.length() - 4);
						s += ".idx";
						FILE * fidx = fopen(s.c_str(), "r");
						if (fidx == nullptr) continue;
						indexFiles.push_back(s);
						fclose(fidx);
					}
				}
			}
			else {
				fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
				exit(-1);
			}
			fclose(flist);
		}

		if (files.size() == indexFiles.size()) {
			// Combine summary index files into one master summary index file
			int file_index = 0;
			char line[4096];
			std::map<summary_keyz, std::vector<long long>> summary_file_to_offset;
			for (std::vector<std::string>::iterator it = indexFiles.begin(); it != indexFiles.end(); ++it) {
				FILE * fidx = fopen(it->c_str(), "r");
				summary_keyz summaryFile;
				summaryFile.fileindex = file_index++;
				while (fgets(line, sizeof(line), fidx) != 0) {
					long long offset;
					int ret = sscanf(line, "%d,%lld", &summaryFile.summary_id, &offset);
					if (ret != 2) {
						fprintf(stderr, "FATAL: Invalid data in file %s:\n%s",
							it->c_str(), line);
						exit(-1);
					}
					summary_file_to_offset[summaryFile].push_back(offset);
				}
				fclose(fidx);
			}
			std::string summaryFile = path + "summaries.idx";
			FILE * fsummaries = fopen(summaryFile.c_str(), "w");
			if (fsummaries == nullptr) {
				fprintf(stderr, "Cannot open %s\n", summaryFile.c_str());
				exit(EXIT_FAILURE);
			}
			for (std::map<summary_keyz, std::vector<long long>>::iterator it_s = summary_file_to_offset.begin();
			     it_s != summary_file_to_offset.end(); ++it_s) {
				for(std::vector<long long>::iterator it_v = it_s->second.begin(); it_v != it_s->second.end(); ++it_v) {
					fprintf(fsummaries, "%d,%d,%lld\n", it_s->first.summary_id, it_s->first.fileindex, *it_v);
				}
			}
			summary_file_to_offset.clear();   // Recover memory
			fclose(fsummaries);

			// Read input files by summary ID using master summary index file
			int summary_id;
			file_index = 0;
			long long file_offset;
			int last_summary_id = -1;
			int last_file_index = -1;
			FILE * fidx = fopen(summaryFile.c_str(), "r");
			FILE * summary_fin = nullptr;
			while (fgets(line, sizeof(line), fidx) != 0) {
				int ret = sscanf(line, "%d,%d,%lld", &summary_id, &file_index, &file_offset);
				if (ret != 3) {
					fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", summaryFile.c_str(), line);
					exit(-1);
				}
				if (last_summary_id != summary_id) {
					if (last_summary_id != -1) {
						summaryids.clear();
						summaryids.insert(last_summary_id);
						outputaggreports(agg, summaryids, out_loss, samplesize, fileIDs_occ, fileIDs_agg, hasEPT);
						out_loss = std::vector<std::map<outkey2, OutLosses>>(2);   // Reset
						skipheader = true;   // Only print header for first summary ID if requested
					}
					last_summary_id = summary_id;
				}
				if (last_file_index != file_index) {
					summary_fin = fileHandles[file_index];
					last_file_index = file_index;
				}
				if (summary_fin != nullptr) {
					std::vector<sampleslevelRec> vrec;
					flseek(summary_fin, file_offset, SEEK_SET);
					summarySampleslevelHeader sh;
					size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
					std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
					if (iter == event_to_periods.end()) continue;   // Event not found so don't process it
					while (i != 0) {
						sampleslevelRec sr;
						i = fread(&sr, sizeof(sr), 1, summary_fin);
						if (i != 1 || sr.sidx == 0) break;
						if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
						dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
					}
				}
			}
			summaryids.clear();
			summaryids.insert(last_summary_id);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		} else {
			if (indexFiles.size() > 0) {
				fprintf(stderr, "%d summary index files missing: "
						"Ignoring summary index files.\n",
					(int)indexFiles.size() - (int)files.size());
			}
			for (std::vector<std::string>::iterator it = files.begin(); it != files.end(); ++it) {
				setinputstream(*it);
				processinputfile(samplesize, event_to_periods,
						 summaryids, out_loss,
						 useReturnPeriodFile, agg);
			}
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		}
	}